

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::dogulitemxsummary(summarycalc *this)

{
  int item_id;
  pointer piVar1;
  int event_id;
  size_t sVar2;
  ostream *poVar3;
  uint uVar4;
  int coverage_or_output_id;
  uint samplesize;
  gulSampleslevelRec gr;
  gulSampleslevelHeader gh;
  uint streamtype;
  
  loadcoverages(this);
  loaditemtocoverage(this);
  loadgulsummaryxref(this);
  outputstreamtype(this);
  streamtype = 0;
  fread(&streamtype,4,1,_stdin);
  if ((streamtype >> 0x18 & 1) != 0) {
    uVar4 = streamtype & 0xffffff;
    samplesize = 0;
    if (uVar4 != 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"summarycalc: Unexpected Gul stream type ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
      std::operator<<(poVar3," expecting gulitem stream\n");
      exit(-1);
    }
    sVar2 = fread(&samplesize,4,1,_stdin);
    uVar4 = samplesize;
    alloc_sssl_array(this,samplesize);
    reset_sssl_array(this,uVar4);
    alloc_sse_array(this);
    reset_sse_array(this);
    outputsamplesize(this,uVar4);
    while (((int)sVar2 == 1 &&
           (sVar2 = fread(&gh,8,1,_stdin), event_id = gh.event_id, (int)sVar2 != 0))) {
      piVar1 = (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      item_id = piVar1[gh.item_id];
      coverage_or_output_id = item_id;
      if ((this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        coverage_or_output_id = piVar1[item_id];
      }
      while ((sVar2 = fread(&gr,8,1,_stdin), (int)sVar2 != 0 && (gr.sidx != 0))) {
        dosummary(this,uVar4,event_id,item_id,coverage_or_output_id,gr.sidx,gr.loss,
                  (this->coverages_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[item_id]);
      }
    }
  }
  return;
}

Assistant:

void summarycalc::dogulitemxsummary()
{
	loadcoverages();
	loaditemtocoverage();
	loadgulsummaryxref();
	outputstreamtype();
	unsigned int streamtype = 0;
	int i = (int) fread(&streamtype, sizeof(streamtype), 1, stdin);
	if (isGulStream(streamtype) == true) {
		int stream_type = streamtype & streamno_mask;
		unsigned int samplesize = 0;
		if (stream_type == 1) {
			i = (int) fread(&samplesize, sizeof(samplesize), 1, stdin);
			alloc_sssl_array(samplesize);
			reset_sssl_array(samplesize);
			alloc_sse_array();
			reset_sse_array();
			outputsamplesize(samplesize);
			gulSampleslevelHeader gh;
			bool havedata = false;
			while (i == 1) {
				i = (int)fread(&gh, sizeof(gh), 1, stdin);
				if (i > 0 && havedata == false) havedata = true;
				if (i == 0) break;
				int coverage_id = item_to_coverage_[gh.item_id];
				int cov_id = getcovid(coverage_id);
				while (i != 0) {
					gulSampleslevelRec gr;
					i = (int) fread(&gr, sizeof(gr), 1, stdin);
					if (i == 0) break;
					if (gr.sidx == 0) break;
					dosummary(samplesize, gh.event_id,
						  coverage_id, cov_id, gr.sidx,
						  gr.loss,
						  coverages_[coverage_id]);
				}
			}
			return;
		}
		std::cerr << "summarycalc: Unexpected Gul stream type " << stream_type << " expecting gulitem stream\n";
		::exit(-1);
	}
}